

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_read_SPCod_SPCoc
                   (opj_j2k_t *p_j2k,OPJ_UINT32 compno,OPJ_BYTE *p_header_data,
                   OPJ_UINT32 *p_header_size,opj_event_mgr_t *p_manager)

{
  opj_tccp_t *poVar1;
  opj_tcp_t *local_68;
  OPJ_BYTE *local_60;
  OPJ_BYTE *l_current_ptr;
  opj_tccp_t *l_tccp;
  opj_tcp_t *l_tcp;
  opj_cp_t *l_cp;
  OPJ_UINT32 l_tmp;
  OPJ_UINT32 i;
  opj_event_mgr_t *p_manager_local;
  OPJ_UINT32 *p_header_size_local;
  OPJ_BYTE *p_header_data_local;
  opj_j2k_t *poStack_18;
  OPJ_UINT32 compno_local;
  opj_j2k_t *p_j2k_local;
  
  _l_tmp = p_manager;
  p_manager_local = (opj_event_mgr_t *)p_header_size;
  p_header_size_local = (OPJ_UINT32 *)p_header_data;
  p_header_data_local._4_4_ = compno;
  poStack_18 = p_j2k;
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x2609,
                  "OPJ_BOOL opj_j2k_read_SPCod_SPCoc(opj_j2k_t *, OPJ_UINT32, OPJ_BYTE *, OPJ_UINT32 *, opj_event_mgr_t *)"
                 );
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x260a,
                  "OPJ_BOOL opj_j2k_read_SPCod_SPCoc(opj_j2k_t *, OPJ_UINT32, OPJ_BYTE *, OPJ_UINT32 *, opj_event_mgr_t *)"
                 );
  }
  if (p_header_data == (OPJ_BYTE *)0x0) {
    __assert_fail("p_header_data != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x260b,
                  "OPJ_BOOL opj_j2k_read_SPCod_SPCoc(opj_j2k_t *, OPJ_UINT32, OPJ_BYTE *, OPJ_UINT32 *, opj_event_mgr_t *)"
                 );
  }
  if ((p_j2k->m_specific_param).m_decoder.m_state == 0x10) {
    local_68 = (p_j2k->m_cp).tcps + p_j2k->m_current_tile_number;
  }
  else {
    local_68 = (p_j2k->m_specific_param).m_decoder.m_default_tcp;
  }
  if (compno < p_j2k->m_private_image->numcomps) {
    poVar1 = local_68->tccps + compno;
    if (*p_header_size < 5) {
      opj_event_msg(p_manager,1,"Error reading SPCod SPCoc element\n");
      p_j2k_local._4_4_ = 0;
    }
    else {
      opj_read_bytes_LE(p_header_data,&poVar1->numresolutions,1);
      poVar1->numresolutions = poVar1->numresolutions + 1;
      if (poVar1->numresolutions < 0x22) {
        if ((p_j2k->m_cp).m_specific_param.m_dec.m_reduce < poVar1->numresolutions) {
          opj_read_bytes_LE(p_header_data + 1,&poVar1->cblkw,1);
          poVar1->cblkw = poVar1->cblkw + 2;
          opj_read_bytes_LE(p_header_data + 2,&poVar1->cblkh,1);
          poVar1->cblkh = poVar1->cblkh + 2;
          if (((poVar1->cblkw < 0xb) && (poVar1->cblkh < 0xb)) &&
             (poVar1->cblkw + poVar1->cblkh < 0xd)) {
            opj_read_bytes_LE(p_header_data + 3,&poVar1->cblksty,1);
            if ((poVar1->cblksty & 0xc0) == 0) {
              opj_read_bytes_LE(p_header_data + 4,&poVar1->qmfbid,1);
              local_60 = p_header_data + 5;
              *(int *)&p_manager_local->m_error_data = *(int *)&p_manager_local->m_error_data + -5;
              if ((poVar1->csty & 1) == 0) {
                for (l_cp._4_4_ = 0; l_cp._4_4_ < poVar1->numresolutions;
                    l_cp._4_4_ = l_cp._4_4_ + 1) {
                  poVar1->prcw[l_cp._4_4_] = 0xf;
                  poVar1->prch[l_cp._4_4_] = 0xf;
                }
              }
              else {
                if (*(uint *)&p_manager_local->m_error_data < poVar1->numresolutions) {
                  opj_event_msg(_l_tmp,1,"Error reading SPCod SPCoc element\n");
                  return 0;
                }
                for (l_cp._4_4_ = 0; l_cp._4_4_ < poVar1->numresolutions;
                    l_cp._4_4_ = l_cp._4_4_ + 1) {
                  opj_read_bytes_LE(local_60,(OPJ_UINT32 *)&l_cp,1);
                  local_60 = local_60 + 1;
                  if ((l_cp._4_4_ != 0) && ((((uint)l_cp & 0xf) == 0 || ((uint)l_cp >> 4 == 0)))) {
                    opj_event_msg(_l_tmp,1,"Invalid precinct size\n");
                    return 0;
                  }
                  poVar1->prcw[l_cp._4_4_] = (uint)l_cp & 0xf;
                  poVar1->prch[l_cp._4_4_] = (uint)l_cp >> 4;
                }
                *(OPJ_UINT32 *)&p_manager_local->m_error_data =
                     *(int *)&p_manager_local->m_error_data - poVar1->numresolutions;
              }
              p_j2k_local._4_4_ = 1;
            }
            else {
              opj_event_msg(_l_tmp,1,
                            "Error reading SPCod SPCoc element, Invalid code-block style found\n");
              p_j2k_local._4_4_ = 0;
            }
          }
          else {
            opj_event_msg(_l_tmp,1,
                          "Error reading SPCod SPCoc element, Invalid cblkw/cblkh combination\n");
            p_j2k_local._4_4_ = 0;
          }
        }
        else {
          opj_event_msg(_l_tmp,1,
                        "Error decoding component %d.\nThe number of resolutions to remove (%d) is greater or equal than the number of resolutions of this component (%d)\nModify the cp_reduce parameter.\n\n"
                        ,(ulong)p_header_data_local._4_4_,
                        (ulong)(p_j2k->m_cp).m_specific_param.m_dec.m_reduce,
                        (ulong)poVar1->numresolutions);
          (poStack_18->m_specific_param).m_decoder.m_state =
               (poStack_18->m_specific_param).m_decoder.m_state | 0x8000;
          p_j2k_local._4_4_ = 0;
        }
      }
      else {
        opj_event_msg(_l_tmp,1,
                      "Invalid value for numresolutions : %d, max value is set in openjpeg.h at %d\n"
                      ,(ulong)poVar1->numresolutions,0x21);
        p_j2k_local._4_4_ = 0;
      }
    }
    return p_j2k_local._4_4_;
  }
  __assert_fail("compno < p_j2k->m_private_image->numcomps",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                ,0x2613,
                "OPJ_BOOL opj_j2k_read_SPCod_SPCoc(opj_j2k_t *, OPJ_UINT32, OPJ_BYTE *, OPJ_UINT32 *, opj_event_mgr_t *)"
               );
}

Assistant:

static OPJ_BOOL opj_j2k_read_SPCod_SPCoc(opj_j2k_t *p_j2k,
        OPJ_UINT32 compno,
        OPJ_BYTE * p_header_data,
        OPJ_UINT32 * p_header_size,
        opj_event_mgr_t * p_manager)
{
    OPJ_UINT32 i, l_tmp;
    opj_cp_t *l_cp = NULL;
    opj_tcp_t *l_tcp = NULL;
    opj_tccp_t *l_tccp = NULL;
    OPJ_BYTE * l_current_ptr = NULL;

    /* preconditions */
    assert(p_j2k != 00);
    assert(p_manager != 00);
    assert(p_header_data != 00);

    l_cp = &(p_j2k->m_cp);
    l_tcp = (p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_TPH) ?
            &l_cp->tcps[p_j2k->m_current_tile_number] :
            p_j2k->m_specific_param.m_decoder.m_default_tcp;

    /* precondition again */
    assert(compno < p_j2k->m_private_image->numcomps);

    l_tccp = &l_tcp->tccps[compno];
    l_current_ptr = p_header_data;

    /* make sure room is sufficient */
    if (*p_header_size < 5) {
        opj_event_msg(p_manager, EVT_ERROR, "Error reading SPCod SPCoc element\n");
        return OPJ_FALSE;
    }

    opj_read_bytes(l_current_ptr, &l_tccp->numresolutions,
                   1);              /* SPcox (D) */
    ++l_tccp->numresolutions;                                                                               /* tccp->numresolutions = read() + 1 */
    if (l_tccp->numresolutions > OPJ_J2K_MAXRLVLS) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Invalid value for numresolutions : %d, max value is set in openjpeg.h at %d\n",
                      l_tccp->numresolutions, OPJ_J2K_MAXRLVLS);
        return OPJ_FALSE;
    }
    ++l_current_ptr;

    /* If user wants to remove more resolutions than the codestream contains, return error */
    if (l_cp->m_specific_param.m_dec.m_reduce >= l_tccp->numresolutions) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Error decoding component %d.\nThe number of resolutions "
                      "to remove (%d) is greater or equal than the number "
                      "of resolutions of this component (%d)\nModify the cp_reduce parameter.\n\n",
                      compno, l_cp->m_specific_param.m_dec.m_reduce, l_tccp->numresolutions);
        p_j2k->m_specific_param.m_decoder.m_state |=
            0x8000;/* FIXME J2K_DEC_STATE_ERR;*/
        return OPJ_FALSE;
    }

    opj_read_bytes(l_current_ptr, &l_tccp->cblkw, 1);               /* SPcoc (E) */
    ++l_current_ptr;
    l_tccp->cblkw += 2;

    opj_read_bytes(l_current_ptr, &l_tccp->cblkh, 1);               /* SPcoc (F) */
    ++l_current_ptr;
    l_tccp->cblkh += 2;

    if ((l_tccp->cblkw > 10) || (l_tccp->cblkh > 10) ||
            ((l_tccp->cblkw + l_tccp->cblkh) > 12)) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Error reading SPCod SPCoc element, Invalid cblkw/cblkh combination\n");
        return OPJ_FALSE;
    }


    opj_read_bytes(l_current_ptr, &l_tccp->cblksty, 1);             /* SPcoc (G) */
    ++l_current_ptr;
    if (l_tccp->cblksty & 0xC0U) { /* 2 msb are reserved, assume we can't read */
        opj_event_msg(p_manager, EVT_ERROR,
                      "Error reading SPCod SPCoc element, Invalid code-block style found\n");
        return OPJ_FALSE;
    }

    opj_read_bytes(l_current_ptr, &l_tccp->qmfbid, 1);              /* SPcoc (H) */
    ++l_current_ptr;

    *p_header_size = *p_header_size - 5;

    /* use custom precinct size ? */
    if (l_tccp->csty & J2K_CCP_CSTY_PRT) {
        if (*p_header_size < l_tccp->numresolutions) {
            opj_event_msg(p_manager, EVT_ERROR, "Error reading SPCod SPCoc element\n");
            return OPJ_FALSE;
        }

        for (i = 0; i < l_tccp->numresolutions; ++i) {
            opj_read_bytes(l_current_ptr, &l_tmp, 1);               /* SPcoc (I_i) */
            ++l_current_ptr;
            /* Precinct exponent 0 is only allowed for lowest resolution level (Table A.21) */
            if ((i != 0) && (((l_tmp & 0xf) == 0) || ((l_tmp >> 4) == 0))) {
                opj_event_msg(p_manager, EVT_ERROR, "Invalid precinct size\n");
                return OPJ_FALSE;
            }
            l_tccp->prcw[i] = l_tmp & 0xf;
            l_tccp->prch[i] = l_tmp >> 4;
        }

        *p_header_size = *p_header_size - l_tccp->numresolutions;
    } else {
        /* set default size for the precinct width and height */
        for (i = 0; i < l_tccp->numresolutions; ++i) {
            l_tccp->prcw[i] = 15;
            l_tccp->prch[i] = 15;
        }
    }

#ifdef WIP_REMOVE_MSD
    /* INDEX >> */
    if (p_j2k->cstr_info && compno == 0) {
        OPJ_UINT32 l_data_size = l_tccp->numresolutions * sizeof(OPJ_UINT32);

        p_j2k->cstr_info->tile[p_j2k->m_current_tile_number].tccp_info[compno].cblkh =
            l_tccp->cblkh;
        p_j2k->cstr_info->tile[p_j2k->m_current_tile_number].tccp_info[compno].cblkw =
            l_tccp->cblkw;
        p_j2k->cstr_info->tile[p_j2k->m_current_tile_number].tccp_info[compno].numresolutions
            = l_tccp->numresolutions;
        p_j2k->cstr_info->tile[p_j2k->m_current_tile_number].tccp_info[compno].cblksty =
            l_tccp->cblksty;
        p_j2k->cstr_info->tile[p_j2k->m_current_tile_number].tccp_info[compno].qmfbid =
            l_tccp->qmfbid;

        memcpy(p_j2k->cstr_info->tile[p_j2k->m_current_tile_number].pdx, l_tccp->prcw,
               l_data_size);
        memcpy(p_j2k->cstr_info->tile[p_j2k->m_current_tile_number].pdy, l_tccp->prch,
               l_data_size);
    }
    /* << INDEX */
#endif

    return OPJ_TRUE;
}